

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_traits.cc
# Opt level: O0

void function_traits_on_lambda(void)

{
  bool bVar1;
  uint uVar2;
  UnitTest *pUVar3;
  ostream *poVar4;
  undefined8 uVar5;
  allocator local_199;
  string local_198 [32];
  BaseCase *local_178;
  BaseCase *cur_case_7;
  string local_168 [32];
  BaseCase *local_148;
  BaseCase *cur_case_6;
  string local_138 [32];
  BaseCase *local_118;
  BaseCase *cur_case_5;
  string local_108 [32];
  BaseCase *local_e8;
  BaseCase *cur_case_4;
  string local_d8 [32];
  BaseCase *local_b8;
  BaseCase *cur_case_3;
  string local_a8 [32];
  BaseCase *local_88;
  BaseCase *cur_case_2;
  string local_78 [32];
  BaseCase *local_58;
  BaseCase *cur_case_1;
  allocator local_39;
  string local_38 [32];
  BaseCase *local_18;
  BaseCase *cur_case;
  anon_class_1_0_00000001 lambda;
  
  pUVar3 = UnitTest::getInstance();
  local_18 = UnitTest::currentCase(pUVar3);
  uVar2 = (*local_18->_vptr_BaseCase[2])();
  if ((uVar2 & 1) != 0) {
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
  }
  pUVar3 = UnitTest::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
             ,&local_39);
  UnitTest::checkFile(pUVar3,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pUVar3 = UnitTest::getInstance();
  UnitTest::checkLine(pUVar3,0x2b);
  pUVar3 = UnitTest::getInstance();
  local_58 = UnitTest::currentCase(pUVar3);
  uVar2 = (*local_58->_vptr_BaseCase[2])();
  if ((uVar2 & 1) != 0) {
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
  }
  pUVar3 = UnitTest::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
             ,(allocator *)((long)&cur_case_2 + 7));
  UnitTest::checkFile(pUVar3,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cur_case_2 + 7));
  pUVar3 = UnitTest::getInstance();
  UnitTest::checkLine(pUVar3,0x2c);
  bVar1 = std::type_info::operator==
                    ((type_info *)&int(bool,char,int)::typeinfo,
                     (type_info *)&int(bool,char,int)::typeinfo);
  if (!bVar1) {
    pUVar3 = UnitTest::getInstance();
    UnitTest::incFailure(pUVar3);
    poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
    poVar4 = std::operator<<(poVar4,
                             "typeid(function_traits<decltype(lambda)>::function_type) == typeid(int(bool, char, int))"
                            );
    poVar4 = std::operator<<(poVar4,"\" failed.");
    poVar4 = std::operator<<(poVar4,"at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2c);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    do_check_failed<>();
  }
  pUVar3 = UnitTest::getInstance();
  local_88 = UnitTest::currentCase(pUVar3);
  uVar2 = (*local_88->_vptr_BaseCase[2])();
  if ((uVar2 & 1) != 0) {
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
  }
  pUVar3 = UnitTest::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
             ,(allocator *)((long)&cur_case_3 + 7));
  UnitTest::checkFile(pUVar3,(string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cur_case_3 + 7));
  pUVar3 = UnitTest::getInstance();
  UnitTest::checkLine(pUVar3,0x2d);
  bVar1 = std::type_info::operator==((type_info *)&int::typeinfo,(type_info *)&int::typeinfo);
  if (!bVar1) {
    pUVar3 = UnitTest::getInstance();
    UnitTest::incFailure(pUVar3);
    poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
    poVar4 = std::operator<<(poVar4,
                             "typeid(function_traits<decltype(lambda)>::return_type) == typeid(int)"
                            );
    poVar4 = std::operator<<(poVar4,"\" failed.");
    poVar4 = std::operator<<(poVar4,"at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2d);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    do_check_failed<>();
  }
  pUVar3 = UnitTest::getInstance();
  local_b8 = UnitTest::currentCase(pUVar3);
  uVar2 = (*local_b8->_vptr_BaseCase[2])();
  if ((uVar2 & 1) == 0) {
    pUVar3 = UnitTest::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
               ,(allocator *)((long)&cur_case_4 + 7));
    UnitTest::checkFile(pUVar3,(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cur_case_4 + 7));
    pUVar3 = UnitTest::getInstance();
    UnitTest::checkLine(pUVar3,0x2e);
    bVar1 = std::type_info::operator==
                      ((type_info *)&std::function<int(bool,char,int)>::typeinfo,
                       (type_info *)&std::function<int(bool,char,int)>::typeinfo);
    if (!bVar1) {
      pUVar3 = UnitTest::getInstance();
      UnitTest::incFailure(pUVar3);
      poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
      poVar4 = std::operator<<(poVar4,
                               "typeid(function_traits<decltype(lambda)>::stl_function_type) == typeid(std::function<int(bool, char, int)>)"
                              );
      poVar4 = std::operator<<(poVar4,"\" failed.");
      poVar4 = std::operator<<(poVar4,"at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2e);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      do_check_failed<>();
    }
    pUVar3 = UnitTest::getInstance();
    local_e8 = UnitTest::currentCase(pUVar3);
    uVar2 = (*local_e8->_vptr_BaseCase[2])();
    if ((uVar2 & 1) != 0) {
      uVar5 = __cxa_allocate_exception(1);
      __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
    }
    pUVar3 = UnitTest::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
               ,(allocator *)((long)&cur_case_5 + 7));
    UnitTest::checkFile(pUVar3,(string *)local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cur_case_5 + 7));
    pUVar3 = UnitTest::getInstance();
    UnitTest::checkLine(pUVar3,0x2f);
    bVar1 = std::type_info::operator==
                      ((type_info *)&(*)(bool,char,int)::typeinfo,
                       (type_info *)&(*)(bool,char,int)::typeinfo);
    if (!bVar1) {
      pUVar3 = UnitTest::getInstance();
      UnitTest::incFailure(pUVar3);
      poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
      poVar4 = std::operator<<(poVar4,
                               "typeid(function_traits<decltype(lambda)>::pointer) == typeid(int(*)(bool, char, int))"
                              );
      poVar4 = std::operator<<(poVar4,"\" failed.");
      poVar4 = std::operator<<(poVar4,"at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2f);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      do_check_failed<>();
    }
    pUVar3 = UnitTest::getInstance();
    local_118 = UnitTest::currentCase(pUVar3);
    uVar2 = (*local_118->_vptr_BaseCase[2])();
    if ((uVar2 & 1) != 0) {
      uVar5 = __cxa_allocate_exception(1);
      __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
    }
    pUVar3 = UnitTest::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
               ,(allocator *)((long)&cur_case_6 + 7));
    UnitTest::checkFile(pUVar3,(string *)local_138);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cur_case_6 + 7));
    pUVar3 = UnitTest::getInstance();
    UnitTest::checkLine(pUVar3,0x30);
    bVar1 = std::type_info::operator==((type_info *)&bool::typeinfo,(type_info *)&bool::typeinfo);
    if (!bVar1) {
      pUVar3 = UnitTest::getInstance();
      UnitTest::incFailure(pUVar3);
      poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
      poVar4 = std::operator<<(poVar4,
                               "typeid(function_traits<decltype(lambda)>::args<0>::type) == typeid(bool)"
                              );
      poVar4 = std::operator<<(poVar4,"\" failed.");
      poVar4 = std::operator<<(poVar4,"at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      do_check_failed<>();
    }
    pUVar3 = UnitTest::getInstance();
    local_148 = UnitTest::currentCase(pUVar3);
    uVar2 = (*local_148->_vptr_BaseCase[2])();
    if ((uVar2 & 1) == 0) {
      pUVar3 = UnitTest::getInstance();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                 ,(allocator *)((long)&cur_case_7 + 7));
      UnitTest::checkFile(pUVar3,(string *)local_168);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cur_case_7 + 7));
      pUVar3 = UnitTest::getInstance();
      UnitTest::checkLine(pUVar3,0x31);
      bVar1 = std::type_info::operator==((type_info *)&char::typeinfo,(type_info *)&char::typeinfo);
      if (!bVar1) {
        pUVar3 = UnitTest::getInstance();
        UnitTest::incFailure(pUVar3);
        poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
        poVar4 = std::operator<<(poVar4,
                                 "typeid(function_traits<decltype(lambda)>::args<1>::type) == typeid(char)"
                                );
        poVar4 = std::operator<<(poVar4,"\" failed.");
        poVar4 = std::operator<<(poVar4,"at ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                );
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x31);
        poVar4 = std::operator<<(poVar4,")");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        do_check_failed<>();
      }
      pUVar3 = UnitTest::getInstance();
      local_178 = UnitTest::currentCase(pUVar3);
      uVar2 = (*local_178->_vptr_BaseCase[2])();
      if ((uVar2 & 1) == 0) {
        pUVar3 = UnitTest::getInstance();
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                   ,&local_199);
        UnitTest::checkFile(pUVar3,(string *)local_198);
        std::__cxx11::string::~string(local_198);
        std::allocator<char>::~allocator((allocator<char> *)&local_199);
        pUVar3 = UnitTest::getInstance();
        UnitTest::checkLine(pUVar3,0x32);
        bVar1 = std::type_info::operator==((type_info *)&int::typeinfo,(type_info *)&int::typeinfo);
        if (!bVar1) {
          pUVar3 = UnitTest::getInstance();
          UnitTest::incFailure(pUVar3);
          poVar4 = std::operator<<((ostream *)&std::cout,">>> check \"");
          poVar4 = std::operator<<(poVar4,
                                   "typeid(function_traits<decltype(lambda)>::args<2>::type) == typeid(int)"
                                  );
          poVar4 = std::operator<<(poVar4,"\" failed.");
          poVar4 = std::operator<<(poVar4,"at ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/lucklove[P]ZBase/test/function_traits.cc"
                                  );
          poVar4 = std::operator<<(poVar4,"(");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x32);
          poVar4 = std::operator<<(poVar4,")");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          do_check_failed<>();
        }
        return;
      }
      uVar5 = __cxa_allocate_exception(1);
      __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
    }
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&AbortThisCase::typeinfo,0);
}

Assistant:

TEST_CASE(function_traits_on_lambda)
{
    auto lambda = [](bool, char, int) { return 0; };
    TEST_CHECK(function_traits<decltype(lambda)>::arity == 3);
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::function_type) == typeid(int(bool, char, int)));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::return_type) == typeid(int));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::stl_function_type) == typeid(std::function<int(bool, char, int)>));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::pointer) == typeid(int(*)(bool, char, int)));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<0>::type) == typeid(bool));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<1>::type) == typeid(char));
    TEST_CHECK(typeid(function_traits<decltype(lambda)>::args<2>::type) == typeid(int));
}